

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O0

void __thiscall bssl::SSL_HANDSHAKE::~SSL_HANDSHAKE(SSL_HANDSHAKE *this)

{
  pointer psVar1;
  SSLTranscript *local_20;
  SSL_HANDSHAKE *this_local;
  
  psVar1 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&this->ssl->ctx);
  (*psVar1->x509_method->hs_flush_cached_ca_names)(this);
  std::unique_ptr<bssl::spake2plus::Verifier,_bssl::internal::Deleter>::~unique_ptr
            (&this->pake_verifier);
  std::unique_ptr<bssl::spake2plus::Prover,_bssl::internal::Deleter>::~unique_ptr
            (&this->pake_prover);
  Array<unsigned_char>::~Array(&this->pake_share_bytes);
  std::unique_ptr<bssl::SSLPAKEShare,_bssl::internal::Deleter>::~unique_ptr(&this->pake_share);
  InplaceVector<unsigned_char,_32UL>::~InplaceVector(&this->session_id);
  std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::~unique_ptr(&this->hints);
  Array<unsigned_char>::~Array(&this->key_block);
  std::unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter>::~unique_ptr(&this->selected_ech_config)
  ;
  std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr(&this->ech_keys);
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&this->early_session);
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&this->new_session);
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&this->peer_pubkey);
  std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr(&this->credential);
  Array<unsigned_char>::~Array(&this->certificate_types);
  Array<unsigned_char>::~Array(&this->peer_available_trust_anchors);
  std::optional<bssl::Array<unsigned_char>_>::~optional(&this->peer_requested_trust_anchors);
  std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr(&this->ca_names);
  std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr(&this->peer_psk_identity_hint);
  Array<unsigned_char>::~Array(&this->server_params);
  internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
  ~StackAllocated(&this->ech_hpke_ctx);
  Array<unsigned_char>::~Array(&this->extension_permutation);
  Array<unsigned_char>::~Array(&this->peer_key);
  Array<unsigned_short>::~Array(&this->peer_delegated_credential_sigalgs);
  Array<unsigned_short>::~Array(&this->peer_supported_group_list);
  Array<unsigned_short>::~Array(&this->peer_sigalgs);
  Array<unsigned_char>::~Array(&this->key_share_ciphertext);
  Array<unsigned_char>::~Array(&this->key_share_bytes);
  Array<unsigned_char>::~Array(&this->ech_client_hello_buf);
  Array<unsigned_char>::~Array(&this->ech_retry_configs);
  Array<unsigned_char>::~Array(&this->ech_client_outer);
  Array<unsigned_char>::~Array(&this->dtls_cookie);
  Array<unsigned_char>::~Array(&this->cookie);
  SSLTranscript::~SSLTranscript(&this->inner_transcript);
  SSLTranscript::~SSLTranscript(&this->transcript);
  local_20 = &this->transcript;
  do {
    local_20 = (SSLTranscript *)((long)(local_20 + -1) + 0x28);
    std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter> *)local_20);
  } while (local_20 != (SSLTranscript *)this->key_shares);
  std::unique_ptr<err_save_state_st,_bssl::internal::Deleter>::~unique_ptr(&this->error);
  InplaceVector<unsigned_char,_64UL>::~InplaceVector(&this->expected_client_finished);
  InplaceVector<unsigned_char,_64UL>::~InplaceVector(&this->server_traffic_secret_0);
  InplaceVector<unsigned_char,_64UL>::~InplaceVector(&this->client_traffic_secret_0);
  InplaceVector<unsigned_char,_64UL>::~InplaceVector(&this->server_handshake_secret);
  InplaceVector<unsigned_char,_64UL>::~InplaceVector(&this->client_handshake_secret);
  InplaceVector<unsigned_char,_64UL>::~InplaceVector(&this->early_traffic_secret);
  InplaceVector<unsigned_char,_64UL>::~InplaceVector(&this->secret);
  return;
}

Assistant:

SSL_HANDSHAKE::~SSL_HANDSHAKE() {
  ssl->ctx->x509_method->hs_flush_cached_ca_names(this);
}